

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gia_GlaSendAbsracted(Gla_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vGateClasses;
  Gia_Man_t *p_00;
  
  iVar1 = Abc_FrameIsBridgeMode();
  if (iVar1 != 0) {
    vGateClasses = Gla_ManTranslate(p);
    p_00 = Gia_ManDupAbsGates(p->pGia0,vGateClasses);
    if (vGateClasses != (Vec_Int_t *)0x0) {
      if (vGateClasses->pArray != (int *)0x0) {
        free(vGateClasses->pArray);
      }
      free(vGateClasses);
    }
    Gia_ManToBridgeAbsNetlist(_stdout,p_00,0x6b);
    Gia_ManStop(p_00);
    return;
  }
  __assert_fail("Abc_FrameIsBridgeMode()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                ,0x62a,"void Gia_GlaSendAbsracted(Gla_Man_t *, int)");
}

Assistant:

void Gia_GlaSendAbsracted( Gla_Man_t * p, int fVerbose )
{
    Gia_Man_t * pAbs;
    Vec_Int_t * vGateClasses;
    assert( Abc_FrameIsBridgeMode() );
//    if ( fVerbose )
//        Abc_Print( 1, "Sending abstracted model...\n" );
    // create abstraction (value of p->pGia is not used here)
    vGateClasses = Gla_ManTranslate( p );
    pAbs = Gia_ManDupAbsGates( p->pGia0, vGateClasses );
    Vec_IntFreeP( &vGateClasses );
    // send it out
    Gia_ManToBridgeAbsNetlist( stdout, pAbs, BRIDGE_ABS_NETLIST );
    Gia_ManStop( pAbs );
}